

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O2

Inta_Man_t * Inta_ManAlloc(void)

{
  Inta_Man_t *pIVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  
  pIVar1 = (Inta_Man_t *)calloc(1,0xa8);
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(4000);
  pVVar2->pArray = piVar3;
  pIVar1->vResLits = pVVar2;
  pIVar1->fProofVerif = 1;
  return pIVar1;
}

Assistant:

Inta_Man_t * Inta_ManAlloc()
{
    Inta_Man_t * p;
    // allocate the manager
    p = (Inta_Man_t *)ABC_ALLOC( char, sizeof(Inta_Man_t) );
    memset( p, 0, sizeof(Inta_Man_t) );
    // verification
    p->vResLits = Vec_IntAlloc( 1000 );
    // parameters
    p->fProofWrite = 0;
    p->fProofVerif = 1;
    return p;    
}